

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_r20.cpp
# Opt level: O1

void __thiscall r20_units_Test::~r20_units_Test(r20_units_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(r20, units)
{
    using namespace units::precise;
    EXPECT_EQ(units::r20_unit("A65"), cgs::erg / (cm.pow(2) * s));

    EXPECT_EQ(
        units::r20_unit("54"),
        units::precise_unit(
            1.0, mass::tonne, units::commodities::packaging::theoretical));

    EXPECT_FALSE(is_valid(units::r20_unit("chaos")));
}